

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O0

int light_get_block_info(light_pcapng pcapng,light_info info_flag,void *info_data,size_t *data_size)

{
  light_option *body_1;
  uint32_t **body;
  uint32_t *length;
  uint32_t *type;
  size_t *data_size_local;
  void *info_data_local;
  light_info info_flag_local;
  light_pcapng pcapng_local;
  int local_4;
  
  if ((pcapng == (light_pcapng)0x0) || (LIGHT_INFO_MAX < info_flag)) {
    local_4 = -3;
  }
  else {
    switch(info_flag) {
    case LIGHT_INFO_TYPE:
      if (info_data != (void *)0x0) {
        *(uint32_t *)info_data = pcapng->block_type;
      }
      if (data_size != (size_t *)0x0) {
        *data_size = 4;
      }
      break;
    case LIGHT_INFO_LENGTH:
      if (info_data != (void *)0x0) {
        *(uint32_t *)info_data = pcapng->block_total_lenght;
      }
      if (data_size != (size_t *)0x0) {
        *data_size = 4;
      }
      break;
    case LIGHT_INFO_BODY:
      if (info_data != (void *)0x0) {
        *(uint32_t **)info_data = pcapng->block_body;
      }
      if (data_size != (size_t *)0x0) {
        *data_size = 8;
      }
      break;
    case LIGHT_INFO_OPTIONS:
      if (info_data != (void *)0x0) {
        *(_light_option **)info_data = pcapng->options;
      }
      if (data_size != (size_t *)0x0) {
        *data_size = 8;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int light_get_block_info(const light_pcapng pcapng, light_info info_flag, void *info_data, size_t *data_size)
{
	if (pcapng == NULL || info_flag < 0 || info_flag > LIGHT_INFO_MAX) {
		return LIGHT_INVALID_ARGUMENT;
	}

	switch (info_flag) {
	case LIGHT_INFO_TYPE:
	{
		uint32_t *type = (uint32_t *)info_data;
		if (type)
			*type = pcapng->block_type;
		if (data_size)
			*data_size = sizeof(*type);
		break;
	}
	case LIGHT_INFO_LENGTH:
	{
		uint32_t *length = (uint32_t *)info_data;
		if (length)
			*length = pcapng->block_total_lenght;
		if (data_size)
			*data_size = sizeof(*length);
		break;
	}
	case LIGHT_INFO_BODY:
	{
		uint32_t **body = (uint32_t **)info_data;
		if (body)
			*body = pcapng->block_body;
		if (data_size)
			*data_size = sizeof(*body);
		break;
	}
	case LIGHT_INFO_OPTIONS:
	{
		light_option *body = (light_option *)info_data;
		if (body)
			*body = pcapng->options;
		if (data_size)
			*data_size = sizeof(*body);
		break;
	}
	default:
		break;
	}

	return LIGHT_SUCCESS;
}